

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Encode(Environmental_Process_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  EnvironmentRecord *pEVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Environmental_Process_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EnvProcID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EnvType).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ModelType);
  pKVar2 = KDataStream::operator<<(pKVar2,(this->field_3).m_ui8EnvStatus);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumEnvRec);
  KDataStream::operator<<(pKVar2,this->m_ui16SeqNum);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
            ::begin(&this->m_vEnvRecords);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
       ::end(&this->m_vEnvRecords);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
              ::operator*(&citrEnd);
    pEVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::operator->(this_00);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Environmental_Process_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EnvProcID
           << KDIS_STREAM m_EnvType
           << m_ui8ModelType
           << m_ui8EnvStatus
           << m_ui16NumEnvRec
           << m_ui16SeqNum;

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}